

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpTokens.cpp
# Opt level: O0

bool __thiscall
glslang::TPpContext::TokenStream::peekTokenizedPasting(TokenStream *this,bool lastTokenPastes)

{
  size_t sVar1;
  byte bVar2;
  bool bVar3;
  bool moreTokens;
  size_t savePos;
  bool lastTokenPastes_local;
  TokenStream *this_local;
  
  sVar1 = this->currentPos;
  while (bVar3 = peekToken(this,0x20), bVar3) {
    this->currentPos = this->currentPos + 1;
  }
  bVar3 = peekToken(this,0x97);
  if (bVar3) {
    this->currentPos = sVar1;
    this_local._7_1_ = true;
  }
  else if (lastTokenPastes) {
    sVar1 = this->currentPos;
    bVar2 = 0;
    while (bVar3 = atEnd(this), !bVar3) {
      bVar3 = peekToken(this,0x20);
      if (!bVar3) {
        bVar2 = 1;
        break;
      }
      this->currentPos = this->currentPos + 1;
    }
    this->currentPos = sVar1;
    this_local._7_1_ = (bool)(bVar2 ^ 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TPpContext::TokenStream::peekTokenizedPasting(bool lastTokenPastes)
{
    // 1. preceding ##?

    size_t savePos = currentPos;
    // skip white space
    while (peekToken(' '))
        ++currentPos;
    if (peekToken(PpAtomPaste)) {
        currentPos = savePos;
        return true;
    }

    // 2. last token and we've been told after this there will be a ##

    if (! lastTokenPastes)
        return false;
    // Getting here means the last token will be pasted, after this

    // Are we at the last non-whitespace token?
    savePos = currentPos;
    bool moreTokens = false;
    do {
        if (atEnd())
            break;
        if (!peekToken(' ')) {
            moreTokens = true;
            break;
        }
        ++currentPos;
    } while (true);
    currentPos = savePos;

    return !moreTokens;
}